

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tableview.cpp
# Opt level: O0

void __thiscall QtMWidgets::TableView::setHighlightCellOnClick(TableView *this,bool on)

{
  bool bVar1;
  TableViewSection **ppTVar2;
  QList<QtMWidgets::TableViewSection_*> *t;
  TableViewSection *sect;
  undefined1 local_50 [8];
  QForeachContainer<QList<QtMWidgets::TableViewSection_*>_> _container_897;
  TableViewPrivate *d;
  bool on_local;
  TableView *this_local;
  
  _container_897._40_8_ = d_func(this);
  if ((bool)(((TableViewPrivate *)_container_897._40_8_)->highlightCellOnClick & 1U) != on) {
    ((TableViewPrivate *)_container_897._40_8_)->highlightCellOnClick = on;
    QtPrivate::qMakeForeachContainer<QList<QtMWidgets::TableViewSection*>&>
              ((QForeachContainer<QList<QtMWidgets::TableViewSection_*>_> *)local_50,
               (QtPrivate *)&((TableViewPrivate *)_container_897._40_8_)->sections,t);
    while( true ) {
      bVar1 = QList<QtMWidgets::TableViewSection_*>::const_iterator::operator!=
                        ((const_iterator *)&_container_897.c.d.size,_container_897.i);
      if (!bVar1) break;
      ppTVar2 = QList<QtMWidgets::TableViewSection_*>::const_iterator::operator*
                          ((const_iterator *)&_container_897.c.d.size);
      TableViewSection::setHighlightCellOnClick(*ppTVar2,on);
      QList<QtMWidgets::TableViewSection_*>::const_iterator::operator++
                ((const_iterator *)&_container_897.c.d.size);
    }
    QtPrivate::QForeachContainer<QList<QtMWidgets::TableViewSection_*>_>::~QForeachContainer
              ((QForeachContainer<QList<QtMWidgets::TableViewSection_*>_> *)local_50);
  }
  return;
}

Assistant:

void
TableView::setHighlightCellOnClick( bool on )
{
	TableViewPrivate * d = d_func();

	if( d->highlightCellOnClick != on )
	{
		d->highlightCellOnClick = on;

		foreach( TableViewSection * sect, d->sections )
			sect->setHighlightCellOnClick( on );
	}
}